

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O3

void __thiscall benchmark::CSVReporter::PrintRunData(CSVReporter *this,Run *run)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  ostream *poVar6;
  BigO complexity;
  char *pcVar7;
  char *pcVar8;
  double dVar9;
  string msg;
  string name;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  poVar6 = (this->super_BenchmarkReporter).output_stream_;
  pcVar3 = (run->benchmark_name)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + (run->benchmark_name)._M_string_length);
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\"","");
  paVar2 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\"\"","");
  ReplaceAll(&local_48,&local_a8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_a8._M_dataplus._M_p._0_1_ = 0x22;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_a8,1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",",2);
  if (run->error_occurred == true) {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct
              ((ulong)&local_a8,
               (char)(DAT_00142a50 - (anonymous_namespace)::elements_abi_cxx11_ >> 5) + -3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"true,",5);
    pcVar3 = (run->error_message)._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar3,pcVar3 + (run->error_message)._M_string_length);
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\"","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\"\"","");
    ReplaceAll(&local_a8,&local_88,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    local_88._M_dataplus._M_p._0_1_ = 0x22;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_88,1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  else {
    if ((run->report_big_o == false) && (run->report_rms == false)) {
      std::ostream::_M_insert<long>((long)poVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    dVar9 = BenchmarkReporter::Run::GetAdjustedRealTime(run);
    poVar5 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    dVar9 = BenchmarkReporter::Run::GetAdjustedCPUTime(run);
    poVar5 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    if (run->report_big_o == true) {
      GetBigOString_abi_cxx11_(&local_a8,(benchmark *)(ulong)run->complexity,complexity);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
    else if (run->report_rms == false) {
      pcVar7 = "ns";
      if (run->time_unit == kMicrosecond) {
        pcVar7 = "us";
      }
      pcVar8 = "ms";
      if (run->time_unit != kMillisecond) {
        pcVar8 = pcVar7;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    if (0.0 < run->bytes_per_second) {
      std::ostream::_M_insert<double>(run->bytes_per_second);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    if (0.0 < run->items_per_second) {
      std::ostream::_M_insert<double>(run->items_per_second);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    sVar4 = (run->report_label)._M_string_length;
    if (sVar4 != 0) {
      pcVar3 = (run->report_label)._M_dataplus._M_p;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar3,pcVar3 + sVar4);
      local_88._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\"","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\"\"","");
      ReplaceAll(&local_a8,&local_88,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",,",2);
    local_a8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_a8,1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CSVReporter::PrintRunData(const Run & run) {
  std::ostream& Out = GetOutputStream();

  // Field with embedded double-quote characters must be doubled and the field
  // delimited with double-quotes.
  std::string name = run.benchmark_name;
  ReplaceAll(&name, "\"", "\"\"");
  Out << '"' << name << "\",";
  if (run.error_occurred) {
    Out << std::string(elements.size() - 3, ',');
    Out << "true,";
    std::string msg = run.error_message;
    ReplaceAll(&msg, "\"", "\"\"");
    Out << '"' << msg << "\"\n";
    return;
  }

  // Do not print iteration on bigO and RMS report
  if (!run.report_big_o && !run.report_rms) {
    Out << run.iterations;
  }
  Out << ",";

  Out << run.GetAdjustedRealTime() << ",";
  Out << run.GetAdjustedCPUTime() << ",";

  // Do not print timeLabel on bigO and RMS report
  if (run.report_big_o) {
    Out << GetBigOString(run.complexity);
  } else if (!run.report_rms) {
    Out << GetTimeUnitString(run.time_unit);
  }
  Out << ",";

  if (run.bytes_per_second > 0.0) {
    Out << run.bytes_per_second;
  }
  Out << ",";
  if (run.items_per_second > 0.0) {
    Out << run.items_per_second;
  }
  Out << ",";
  if (!run.report_label.empty()) {
    // Field with embedded double-quote characters must be doubled and the field
    // delimited with double-quotes.
    std::string label = run.report_label;
    ReplaceAll(&label, "\"", "\"\"");
    Out << "\"" << label << "\"";
  }
  Out << ",,";  // for error_occurred and error_message
  Out << '\n';
}